

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O3

RDL_cycle * RDL_cycleIteratorGetCycle(RDL_cycleIterator *it)

{
  undefined4 uVar1;
  undefined4 uVar2;
  RDL_node *pRVar3;
  uchar uVar4;
  RDL_cycle *pRVar5;
  RDL_edge *paRVar6;
  RDL_BCCGraph *pRVar7;
  uint uVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (it == (RDL_cycleIterator *)0x0) {
    pcVar9 = "Iterator is NULL!\n";
  }
  else {
    if (it->end == '\0') {
      if (it->mode == 'b') {
        pRVar5 = (RDL_cycle *)malloc(0x18);
        paRVar6 = (RDL_edge *)malloc(0x200);
        pRVar5->edges = paRVar6;
        uVar1 = it->running_rcf;
        uVar2 = it->running_urf;
        pRVar5->urf = uVar2;
        pRVar5->rcf = uVar1;
        if (it->data->bccGraphs->bcc_graphs[it->bcc_index]->E == 0) {
          uVar8 = 0;
        }
        else {
          uVar10 = 0;
          uVar11 = 0x40;
          uVar8 = 0;
          do {
            uVar4 = RDL_bitset_test(it->compressed_cycle,(uint)uVar10);
            if (uVar4 == '\0') {
              pRVar7 = it->data->bccGraphs;
            }
            else {
              if ((uint)uVar11 <= uVar8) {
                uVar11 = (ulong)((uint)uVar11 * 2);
                paRVar6 = (RDL_edge *)realloc(paRVar6,uVar11 * 8);
                pRVar5->edges = paRVar6;
              }
              pRVar7 = it->data->bccGraphs;
              pRVar3 = it->data->graph->edges[pRVar7->edge_from_bcc_mapping[it->bcc_index][uVar10]];
              paRVar6[uVar8][0] = *pRVar3;
              paRVar6[uVar8][1] = pRVar3[1];
              uVar8 = uVar8 + 1;
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 < pRVar7->bcc_graphs[it->bcc_index]->E);
        }
        paRVar6 = (RDL_edge *)realloc(paRVar6,(ulong)uVar8 << 3);
        pRVar5->edges = paRVar6;
        pRVar5->weight = uVar8;
        return pRVar5;
      }
      (*RDL_outputFunc)(RDL_ERROR,"Cycle conversion only works for edge defined cycles!\n");
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RDLhandler.c"
                    ,0x204,"RDL_cycle *RDL_cycleIteratorGetCycle(RDL_cycleIterator *)");
    }
    pcVar9 = "Cannot retrieve cycle of iterator at end!\n";
  }
  (*RDL_outputFunc)(RDL_ERROR,pcVar9);
  return (RDL_cycle *)0x0;
}

Assistant:

RDL_cycle* RDL_cycleIteratorGetCycle(RDL_cycleIterator* it)
{
  unsigned edgeCount = 0, j, mapped_edge, alloced = 64;
  RDL_cycle* rdl_cycle;

  if (it == NULL) {
    RDL_outputFunc(RDL_ERROR, "Iterator is NULL!\n");
    return NULL;
  }

  if (RDL_cycleIteratorAtEnd(it)) {
    RDL_outputFunc(RDL_ERROR, "Cannot retrieve cycle of iterator at end!\n");
    return NULL;
  }

  if (it->mode != 'b') {
    RDL_outputFunc(RDL_ERROR, "Cycle conversion only works for edge defined cycles!\n");
    /* will never happen, when using the public interface! */
    assert(0);
    return NULL;
  }

  rdl_cycle = malloc(sizeof(*rdl_cycle));

  rdl_cycle->edges = malloc(alloced * sizeof(*rdl_cycle->edges));
  rdl_cycle->urf = it->running_urf;
  rdl_cycle->rcf = it->running_rcf;

  for(j=0; j < it->data->bccGraphs->bcc_graphs[it->bcc_index]->E; ++j) {
    if(RDL_bitset_test(it->compressed_cycle, j)) {
      if (edgeCount >= alloced) {
        alloced *= 2;
        rdl_cycle->edges = realloc(rdl_cycle->edges, alloced * sizeof(*rdl_cycle->edges));
      }
      mapped_edge = it->data->bccGraphs->edge_from_bcc_mapping[it->bcc_index][j];
      rdl_cycle->edges[edgeCount][0] = it->data->graph->edges[mapped_edge][0];
      rdl_cycle->edges[edgeCount][1] = it->data->graph->edges[mapped_edge][1];
      ++edgeCount;
    }
  }

  rdl_cycle->edges = realloc(rdl_cycle->edges, edgeCount * sizeof(*rdl_cycle->edges));
  rdl_cycle->weight = edgeCount;

  return rdl_cycle;
}